

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O2

uint64_t __thiscall duckdb::ListColumnData::FetchListOffset(ListColumnData *this,idx_t row_idx)

{
  uint64_t uVar1;
  ColumnSegment *pCVar2;
  LogicalType LStack_e8;
  ColumnFetchState fetch_state;
  Vector result;
  
  pCVar2 = SegmentTree<duckdb::ColumnSegment,_false>::GetSegment
                     (&(this->super_ColumnData).data.super_SegmentTree<duckdb::ColumnSegment,_false>
                      ,row_idx);
  fetch_state.handles._M_h._M_buckets = &fetch_state.handles._M_h._M_single_bucket;
  fetch_state.handles._M_h._M_bucket_count = 1;
  fetch_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  fetch_state.handles._M_h._M_element_count = 0;
  fetch_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  fetch_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  fetch_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  fetch_state.child_states.
  super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fetch_state.child_states.
  super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fetch_state.child_states.
  super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&LStack_e8,&(this->super_ColumnData).type);
  Vector::Vector(&result,&LStack_e8,1);
  LogicalType::~LogicalType(&LStack_e8);
  (*((pCVar2->function)._M_data)->fetch_row)
            (pCVar2,&fetch_state,row_idx - (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).start,
             &result,0);
  uVar1 = *(uint64_t *)result.data;
  Vector::~Vector(&result);
  ColumnFetchState::~ColumnFetchState(&fetch_state);
  return uVar1;
}

Assistant:

uint64_t ListColumnData::FetchListOffset(idx_t row_idx) {
	auto segment = data.GetSegment(row_idx);
	ColumnFetchState fetch_state;
	Vector result(type, 1);
	segment->FetchRow(fetch_state, UnsafeNumericCast<row_t>(row_idx), result, 0U);

	// initialize the child scan with the required offset
	return FlatVector::GetData<uint64_t>(result)[0];
}